

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlFAParseBranch(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr to)

{
  xmlChar xVar1;
  int iVar2;
  int extraout_EAX;
  xmlRegStatePtr to_00;
  xmlRegStatePtr from;
  
  from = ctxt->state;
  iVar2 = xmlFAParsePiece(ctxt);
  if (iVar2 == 0) {
    iVar2 = xmlFAGenerateEpsilonTransition(ctxt,from,to);
    return iVar2;
  }
  do {
    xVar1 = *ctxt->cur;
    to_00 = to;
    if (((xVar1 != '\0') && (xVar1 != '|')) && (xVar1 != ')')) {
      to_00 = (xmlRegStatePtr)0x0;
    }
    iVar2 = xmlFAGenerateTransitions(ctxt,from,to_00,ctxt->atom);
    if (iVar2 < 0) {
      xmlRegFreeAtom(ctxt->atom);
      ctxt->atom = (xmlRegAtomPtr)0x0;
      return extraout_EAX;
    }
    from = ctxt->state;
    ctxt->atom = (xmlRegAtomPtr)0x0;
    if (ctxt->error != 0) {
      return iVar2;
    }
    iVar2 = xmlFAParsePiece(ctxt);
  } while (iVar2 != 0);
  return 0;
}

Assistant:

static int
xmlFAParseBranch(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr to) {
    xmlRegStatePtr previous;
    int ret;

    previous = ctxt->state;
    ret = xmlFAParsePiece(ctxt);
    if (ret == 0) {
        /* Empty branch */
	xmlFAGenerateEpsilonTransition(ctxt, previous, to);
    } else {
	if (xmlFAGenerateTransitions(ctxt, previous,
	        (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                ctxt->atom) < 0) {
            xmlRegFreeAtom(ctxt->atom);
            ctxt->atom = NULL;
	    return(-1);
        }
	previous = ctxt->state;
	ctxt->atom = NULL;
    }
    while ((ret != 0) && (ctxt->error == 0)) {
	ret = xmlFAParsePiece(ctxt);
	if (ret != 0) {
	    if (xmlFAGenerateTransitions(ctxt, previous,
	            (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                    ctxt->atom) < 0) {
                xmlRegFreeAtom(ctxt->atom);
                ctxt->atom = NULL;
                return(-1);
            }
	    previous = ctxt->state;
	    ctxt->atom = NULL;
	}
    }
    return(0);
}